

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomConnection::read(DomConnection *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  DomConnectionHints *this_00;
  char16_t *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  QString *pQVar2;
  QString *this_01;
  long in_FS_OFFSET;
  QStringView QVar3;
  QStringView QVar4;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QString local_60;
  QStringView local_48;
  long local_38;
  
  pQVar2 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QXmlStreamReader::error();
  if (iVar1 == 0) {
    do {
      iVar1 = QXmlStreamReader::readNext();
      if (iVar1 == 4) {
        local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = (QStringView)QXmlStreamReader::name();
        QVar3.m_data = L"sender";
        QVar3.m_size = 6;
        iVar1 = QtPrivate::compareStrings(local_48,QVar3,CaseInsensitive);
        if (iVar1 == 0) {
          QXmlStreamReader::readElementText(&local_60,pQVar2,0);
          *(byte *)&this->m_children = (byte)this->m_children | 1;
          this_01 = &this->m_sender;
LAB_0016c257:
          QString::operator=(this_01,&local_60);
        }
        else {
          QVar4.m_data = L"signal";
          QVar4.m_size = 6;
          iVar1 = QtPrivate::compareStrings(local_48,QVar4,CaseInsensitive);
          if (iVar1 == 0) {
            QXmlStreamReader::readElementText(&local_60,pQVar2,0);
            *(byte *)&this->m_children = (byte)this->m_children | 2;
            this_01 = &this->m_signal;
            goto LAB_0016c257;
          }
          QVar5.m_data = L"receiver";
          QVar5.m_size = 8;
          iVar1 = QtPrivate::compareStrings(local_48,QVar5,CaseInsensitive);
          if (iVar1 == 0) {
            QXmlStreamReader::readElementText(&local_60,pQVar2,0);
            *(byte *)&this->m_children = (byte)this->m_children | 4;
            this_01 = &this->m_receiver;
            goto LAB_0016c257;
          }
          QVar6.m_data = L"slot";
          QVar6.m_size = 4;
          iVar1 = QtPrivate::compareStrings(local_48,QVar6,CaseInsensitive);
          if (iVar1 == 0) {
            QXmlStreamReader::readElementText(&local_60,pQVar2,0);
            *(byte *)&this->m_children = (byte)this->m_children | 8;
            this_01 = &this->m_slot;
            goto LAB_0016c257;
          }
          QVar7.m_data = L"hints";
          QVar7.m_size = 5;
          __nbytes_00 = L"hints";
          iVar1 = QtPrivate::compareStrings(local_48,QVar7,CaseInsensitive);
          if (iVar1 == 0) {
            this_00 = (DomConnectionHints *)operator_new(0x20);
            *(undefined8 *)this_00 = 0;
            (this_00->m_hint).d.d = (Data *)0x0;
            (this_00->m_hint).d.ptr = (DomConnectionHint **)0x0;
            (this_00->m_hint).d.size = 0;
            DomConnectionHints::read(this_00,__fd,__buf_00,(size_t)__nbytes_00);
            setElementHints(this,this_00);
            goto LAB_0016c282;
          }
          local_78.a.m_size = 0x13;
          local_78.a.m_data = "Unexpected element ";
          local_78.b = &local_48;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    (&local_60,&local_78);
          QXmlStreamReader::raiseError(pQVar2);
        }
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else if (iVar1 == 5) break;
LAB_0016c282:
      iVar1 = QXmlStreamReader::error();
    } while (iVar1 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomConnection::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"sender"_s, Qt::CaseInsensitive)) {
                setElementSender(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"signal"_s, Qt::CaseInsensitive)) {
                setElementSignal(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"receiver"_s, Qt::CaseInsensitive)) {
                setElementReceiver(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"slot"_s, Qt::CaseInsensitive)) {
                setElementSlot(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"hints"_s, Qt::CaseInsensitive)) {
                auto *v = new DomConnectionHints();
                v->read(reader);
                setElementHints(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}